

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpBase::BeginModule
          (BinaryReaderObjdumpBase *this,uint32_t version)

{
  bool bVar1;
  wabt *this_00;
  char *extraout_RDX;
  char *pcVar2;
  string_view filename;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  allocator<char> local_41;
  string_view local_40;
  undefined8 local_30 [4];
  
  switch(this->options_->mode) {
  case Prepass:
    pcVar2 = this->options_->filename;
    this_00 = (wabt *)strlen(pcVar2);
    filename._M_str = extraout_RDX;
    filename._M_len = (size_t)pcVar2;
    local_40 = GetBasename(this_00,filename);
    __y._M_str = "-";
    __y._M_len = 1;
    bVar1 = std::operator==(local_40,__y);
    if (bVar1) {
      local_40._M_str = "<stdin>";
      local_40._M_len = 7;
    }
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_30,&local_40,&local_41);
    printf("%s:\tfile format wasm %#x\n",local_30[0],version);
    std::__cxx11::string::_M_dispose();
    return (Result)Ok;
  case Headers:
    putchar(10);
    pcVar2 = "Sections:\n";
    break;
  case Details:
    putchar(10);
    pcVar2 = "Section Details:\n";
    break;
  case Disassemble:
    putchar(10);
    pcVar2 = "Code Disassembly:\n";
    break;
  default:
    goto switchD_00111814_default;
  }
  puts(pcVar2);
switchD_00111814_default:
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpBase::BeginModule(uint32_t version) {
  switch (options_->mode) {
    case ObjdumpMode::Headers:
      printf("\n");
      printf("Sections:\n\n");
      break;
    case ObjdumpMode::Details:
      printf("\n");
      printf("Section Details:\n\n");
      break;
    case ObjdumpMode::Disassemble:
      printf("\n");
      printf("Code Disassembly:\n\n");
      break;
    case ObjdumpMode::Prepass: {
      std::string_view basename = GetBasename(options_->filename);
      if (basename == "-") {
        basename = "<stdin>";
      }
      printf("%s:\tfile format wasm %#x\n", std::string(basename).c_str(),
             version);
      break;
    }
    case ObjdumpMode::RawData:
      break;
  }

  return Result::Ok;
}